

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O2

void __thiscall
DisconnectedBlockTransactions::removeForBlock
          (DisconnectedBlockTransactions *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx)

{
  long lVar1;
  pointer psVar2;
  const_iterator __position;
  iterator __it;
  size_t sVar3;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->queuedTx).
      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->queuedTx) {
    psVar2 = (vtx->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (vtx->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1)
    {
      __it = std::
             _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->iters_by_txid)._M_h,
                    &(((psVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->hash).m_wrapped);
      if (__it.
          super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        __position._M_node =
             *(_List_node_base **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
                     ._M_cur + 0x28);
        std::
        _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::erase(&(this->iters_by_txid)._M_h,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_true>
                ._M_cur);
        sVar3 = RecursiveDynamicUsage<CTransaction_const>
                          ((shared_ptr<const_CTransaction> *)(__position._M_node + 1));
        this->cachedInnerUsage = this->cachedInnerUsage - sVar3;
        std::__cxx11::
        list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::erase(&this->queuedTx,__position);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DisconnectedBlockTransactions::removeForBlock(const std::vector<CTransactionRef>& vtx)
{
    // Short-circuit in the common case of a block being added to the tip
    if (queuedTx.empty()) {
        return;
    }
    for (const auto& tx : vtx) {
        auto iter = iters_by_txid.find(tx->GetHash());
        if (iter != iters_by_txid.end()) {
            auto list_iter = iter->second;
            iters_by_txid.erase(iter);
            cachedInnerUsage -= RecursiveDynamicUsage(*list_iter);
            queuedTx.erase(list_iter);
        }
    }
}